

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_observer.hpp
# Opt level: O0

void __thiscall
afsm::test::test_fsm_observer::
state_changed<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::ready_for_query>
          (test_fsm_observer *this,
          state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          *param_1,inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                   *param_2,
          state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *param_3,ready_for_query *param_4)

{
  ansi_color val;
  ostream *poVar1;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  char local_36;
  char local_35;
  int local_34;
  ready_for_query *local_30;
  ready_for_query *param_4_local;
  state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  *param_3_local;
  inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  *param_2_local;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *param_1_local;
  test_fsm_observer *this_local;
  
  local_30 = param_4;
  param_4_local = (ready_for_query *)param_3;
  param_3_local =
       (state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        *)param_2;
  param_2_local =
       (inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        *)param_1;
  param_1_local =
       (state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
        *)this;
  val = psst::operator|(blue,bright);
  poVar1 = psst::operator<<((ostream *)&std::cerr,val);
  local_34 = (int)std::setw(0x11);
  poVar1 = std::operator<<(poVar1,(_Setw)local_34);
  local_35 = (char)std::setfill<char>('*');
  poVar1 = std::operator<<(poVar1,local_35);
  poVar1 = std::operator<<(poVar1,"*");
  poVar1 = psst::operator<<(poVar1,clear);
  local_36 = (char)std::setfill<char>(' ');
  poVar1 = std::operator<<(poVar1,local_36);
  poVar1 = std::operator<<(poVar1,": State changed ");
  psst::util::demangle<afsm::test::connection_fsm_def::transaction>();
  get_name_components_after(&local_58,&local_78,&this->def_name);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1," -> ");
  psst::util::demangle<afsm::test::connection_fsm_def::idle>();
  get_name_components_after(&local_98,&local_b8,&this->def_name);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  poVar1 = std::operator<<(poVar1," (");
  psst::util::demangle<afsm::test::events::ready_for_query>();
  get_name_components(&local_d8,&local_f8,1);
  poVar1 = std::operator<<(poVar1,(string *)&local_d8);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void
    state_changed(FSM const&, SourceState const&, TargetState const&, Event const&) const noexcept
    {
        using ::psst::ansi_color;
        using ::psst::util::demangle;
        ::std::cerr
             << (ansi_color::blue | ansi_color::bright)
             << ::std::setw(event_name_width) << ::std::setfill('*')
             << "*" << ansi_color::clear  << ::std::setfill(' ')
             << ": State changed "
             << get_name_components_after(
                     demangle< typename SourceState::state_definition_type >(),
                     def_name)
             << " -> "
             << get_name_components_after(
                     demangle< typename TargetState::state_definition_type >(),
                     def_name)
             << " (" << get_name_components(demangle<Event>(), 1) << ")\n";
    }